

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

double * cheby_u_poly_zero(int n)

{
  double *pdVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  uVar2 = 0xffffffffffffffff;
  if (-1 < n) {
    uVar2 = (ulong)(uint)n << 3;
  }
  uVar3 = 0;
  if (0 < n) {
    uVar3 = (ulong)(uint)n;
  }
  pdVar1 = (double *)operator_new__(uVar2);
  uVar2 = 0;
  while (uVar3 != uVar2) {
    dVar4 = cos(((double)(int)(uVar2 + 1) * 3.141592653589793) / (double)(n + 1));
    pdVar1[uVar2] = dVar4;
    uVar2 = uVar2 + 1;
  }
  return pdVar1;
}

Assistant:

double *cheby_u_poly_zero ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    CHEBY_U_POLY_ZERO returns zeroes of Chebyshev polynomials U(n,x).
//
//  Discussion:
//
//    The I-th zero of U(N,X) is cos((I-1)*PI/(N-1)), I = 1 to N
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    18 March 2009
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the order of the polynomial.
//
//    Output, double CHEBY_U_POLY_ZERO[N], the zeroes of U(N,X).
//
{
  double angle;
  int i;
  const double r8_pi = 3.141592653589793;
  double *z;

  z = new double[n];

  for ( i = 0; i < n; i++ )
  {
    angle = double( i + 1 ) * r8_pi / double( n + 1 );
    z[i] = cos ( angle );
  }

  return z;
}